

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  Model *pMVar4;
  invalid_argument *this_00;
  long lVar5;
  int i;
  long lVar6;
  ulong uVar7;
  vector<int,_std::allocator<int>_> idx;
  shared_ptr<fasttext::Matrix> ninput;
  __shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> local_48;
  long local_38;
  
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->model == sup) {
    std::__cxx11::string::_M_assign((string *)peVar2);
    peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->qout = qargs->qout;
    std::__cxx11::string::_M_assign((string *)&peVar2->output);
    uVar7 = qargs->cutoff;
    if ((uVar7 != 0) &&
       (uVar7 < (ulong)((this->input_).
                        super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_
       )) {
      selectEmbeddings(&idx,this,(int32_t)uVar7);
      Dictionary::prune((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &idx);
      local_38 = (long)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      std::make_shared<fasttext::Matrix,unsigned_long,int&>
                ((unsigned_long *)&ninput,(int *)&local_38);
      peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar5 = 0;
      for (lVar6 = 0;
          lVar6 != (long)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2; lVar6 = lVar6 + 1) {
        uVar1 = peVar2->dim;
        peVar3 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        for (uVar7 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar7; uVar7 = uVar7 + 1) {
          *(undefined4 *)
           (((long *)CONCAT44(ninput.
                              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._4_4_,
                              ninput.
                              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._0_4_))[4] * lVar5 +
            *(long *)CONCAT44(ninput.
                              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._4_4_,
                              ninput.
                              super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._0_4_) + uVar7 * 4) =
               *(undefined4 *)
                ((long)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar6] * peVar3->n_ * 4 +
                 (long)(peVar3->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar7 * 4);
        }
        lVar5 = lVar5 + 4;
      }
      std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                 &ninput.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
      if (qargs->retrain != false) {
        peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        peVar2->epoch = qargs->epoch;
        peVar2->lr = qargs->lr;
        peVar2->thread = qargs->thread;
        peVar2->verbose = qargs->verbose;
        startThreads(this);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ninput.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&idx.super__Vector_base<int,_std::allocator<int>_>);
    }
    std::make_shared<fasttext::QMatrix,fasttext::Matrix&,unsigned_long_const&,bool_const&>
              ((Matrix *)&idx,
               (unsigned_long *)
               (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(bool *)&qargs->dsub);
    std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> *)&idx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish);
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true) {
      ninput.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
      std::make_shared<fasttext::QMatrix,fasttext::Matrix&,int,bool_const&>
                ((Matrix *)&idx,
                 (int *)(this->output_).
                        super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (bool *)&ninput);
      std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>
                 ,(__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2> *)&idx);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish);
    }
    this->quant_ = true;
    ninput.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    std::
    make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
              ((shared_ptr<fasttext::Matrix> *)&idx,&this->input_,
               (shared_ptr<fasttext::Args> *)&this->output_,(int *)this);
    std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> *)&idx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish);
    pMVar4 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pMVar4->quant_ = this->quant_;
    std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,
               &(this->qinput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               &(this->qoutput_).super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>);
    Model::setQuantizePointer
              (pMVar4,(shared_ptr<fasttext::QMatrix> *)&local_48,
               (shared_ptr<fasttext::QMatrix> *)&local_58,
               ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->qout);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    pMVar4 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
        == sup) {
      Dictionary::getCounts
                ((vector<long,_std::allocator<long>_> *)&idx,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,label);
      Model::setTargetCounts(pMVar4,(vector<long,_std::allocator<long>_> *)&idx);
    }
    else {
      Dictionary::getCounts
                ((vector<long,_std::allocator<long>_> *)&idx,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,word);
      Model::setTargetCounts(pMVar4,(vector<long,_std::allocator<long>_> *)&idx);
    }
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&idx);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"For now we only support quantization of supervised models");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::quantize(const Args qargs) {
  if (args_->model != model_name::sup) {
    throw std::invalid_argument(
        "For now we only support quantization of supervised models");
  }
  args_->input = qargs.input;
  args_->qout = qargs.qout;
  args_->output = qargs.output;

  if (qargs.cutoff > 0 && qargs.cutoff < input_->size(0)) {
    auto idx = selectEmbeddings(qargs.cutoff);
    dict_->prune(idx);
    std::shared_ptr<Matrix> ninput =
        std::make_shared<Matrix>(idx.size(), args_->dim);
    for (auto i = 0; i < idx.size(); i++) {
      for (auto j = 0; j < args_->dim; j++) {
        ninput->at(i, j) = input_->at(idx[i], j);
      }
    }
    input_ = ninput;
    if (qargs.retrain) {
      args_->epoch = qargs.epoch;
      args_->lr = qargs.lr;
      args_->thread = qargs.thread;
      args_->verbose = qargs.verbose;
      startThreads();
    }
  }

  qinput_ = std::make_shared<QMatrix>(*input_, qargs.dsub, qargs.qnorm);

  if (args_->qout) {
    qoutput_ = std::make_shared<QMatrix>(*output_, 2, qargs.qnorm);
  }

  quant_ = true;
  model_ = std::make_shared<Model>(input_, output_, args_, 0);
  model_->quant_ = quant_;
  model_->setQuantizePointer(qinput_, qoutput_, args_->qout);
  if (args_->model == model_name::sup) {
    model_->setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model_->setTargetCounts(dict_->getCounts(entry_type::word));
  }
}